

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall TestExpectMacroInternal::Run(TestExpectMacroInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  *in_RDX;
  string local_88;
  testinator local_68 [8];
  char *local_60;
  undefined4 local_58;
  char *local_50;
  undefined1 local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined1 local_28;
  char *local_20;
  
  pOVar1 = (this->super_Test).m_op;
  local_60 = 
  "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
  ;
  local_58 = 0xb8;
  local_50 = " (!fail == fail => ";
  local_48 = 0;
  local_40 = " ";
  local_38 = "==";
  local_30 = " ";
  local_28 = 1;
  local_20 = ")";
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
            (&local_88,local_68,in_RDX);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).m_success = false;
  return true;
}

Assistant:

virtual bool Run()
  {
    bool fail = true;
    EXPECT(!fail == fail);
    return true;
  }